

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void idct32x32_low1_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar6;
  uint uVar7;
  undefined1 auVar5 [16];
  uint uVar8;
  undefined1 auVar9 [16];
  int iVar10;
  
  auVar9 = ZEXT416((uint)bit);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + (long)bit * 0x100 + 0x1e0);
  auVar5._4_4_ = uVar1;
  auVar5._0_4_ = uVar1;
  auVar5._8_4_ = uVar1;
  auVar5._12_4_ = uVar1;
  iVar3 = 1 << ((char)bit - 1U & 0x1f);
  auVar5 = pmulld(auVar5,(undefined1  [16])*in);
  uVar4 = auVar5._0_4_ + iVar3 >> auVar9;
  uVar6 = auVar5._4_4_ + iVar3 >> auVar9;
  uVar7 = auVar5._8_4_ + iVar3 >> auVar9;
  uVar8 = auVar5._12_4_ + iVar3 >> auVar9;
  if (do_cols == 0) {
    iVar3 = 10;
    if (10 < bd) {
      iVar3 = bd;
    }
    iVar3 = 0x20 << ((byte)iVar3 & 0x1f);
    iVar2 = -iVar3;
    iVar3 = iVar3 + -1;
    if (out_shift != 0) {
      iVar10 = (1 << ((byte)out_shift & 0x1f)) >> 1;
      auVar5 = ZEXT416((uint)out_shift);
      uVar4 = (int)(uVar4 + iVar10) >> auVar5;
      uVar6 = (int)(uVar6 + iVar10) >> auVar5;
      uVar7 = (int)(uVar7 + iVar10) >> auVar5;
      uVar8 = (int)(uVar8 + iVar10) >> auVar5;
    }
  }
  else {
    iVar2 = 0x8000;
    if (9 < bd) {
      iVar2 = 1 << ((char)bd + 5U & 0x1f);
    }
    iVar3 = iVar2 + -1;
    iVar2 = -iVar2;
    uVar4 = (uint)((int)uVar4 < iVar2) * iVar2 | ((int)uVar4 >= iVar2) * uVar4;
    uVar6 = (uint)((int)uVar6 < iVar2) * iVar2 | ((int)uVar6 >= iVar2) * uVar6;
    uVar7 = (uint)((int)uVar7 < iVar2) * iVar2 | ((int)uVar7 >= iVar2) * uVar7;
    uVar8 = (uint)((int)uVar8 < iVar2) * iVar2 | ((int)uVar8 >= iVar2) * uVar8;
    uVar4 = (uint)(iVar3 < (int)uVar4) * iVar3 | (iVar3 >= (int)uVar4) * uVar4;
    uVar6 = (uint)(iVar3 < (int)uVar6) * iVar3 | (iVar3 >= (int)uVar6) * uVar6;
    uVar7 = (uint)(iVar3 < (int)uVar7) * iVar3 | (iVar3 >= (int)uVar7) * uVar7;
    uVar8 = (uint)(iVar3 < (int)uVar8) * iVar3 | (iVar3 >= (int)uVar8) * uVar8;
  }
  uVar4 = (uint)((int)uVar4 < iVar2) * iVar2 | ((int)uVar4 >= iVar2) * uVar4;
  uVar6 = (uint)((int)uVar6 < iVar2) * iVar2 | ((int)uVar6 >= iVar2) * uVar6;
  uVar7 = (uint)((int)uVar7 < iVar2) * iVar2 | ((int)uVar7 >= iVar2) * uVar7;
  uVar8 = (uint)((int)uVar8 < iVar2) * iVar2 | ((int)uVar8 >= iVar2) * uVar8;
  uVar4 = (uint)(iVar3 < (int)uVar4) * iVar3 | (iVar3 >= (int)uVar4) * uVar4;
  uVar6 = (uint)(iVar3 < (int)uVar6) * iVar3 | (iVar3 >= (int)uVar6) * uVar6;
  uVar7 = (uint)(iVar3 < (int)uVar7) * iVar3 | (iVar3 >= (int)uVar7) * uVar7;
  uVar8 = (uint)(iVar3 < (int)uVar8) * iVar3 | (iVar3 >= (int)uVar8) * uVar8;
  *(uint *)*out = uVar4;
  *(uint *)((long)*out + 4) = uVar6;
  *(uint *)(*out + 1) = uVar7;
  *(uint *)((long)*out + 0xc) = uVar8;
  *(uint *)out[1] = uVar4;
  *(uint *)((long)out[1] + 4) = uVar6;
  *(uint *)(out[1] + 1) = uVar7;
  *(uint *)((long)out[1] + 0xc) = uVar8;
  *(uint *)out[2] = uVar4;
  *(uint *)((long)out[2] + 4) = uVar6;
  *(uint *)(out[2] + 1) = uVar7;
  *(uint *)((long)out[2] + 0xc) = uVar8;
  *(uint *)out[3] = uVar4;
  *(uint *)((long)out[3] + 4) = uVar6;
  *(uint *)(out[3] + 1) = uVar7;
  *(uint *)((long)out[3] + 0xc) = uVar8;
  *(uint *)out[4] = uVar4;
  *(uint *)((long)out[4] + 4) = uVar6;
  *(uint *)(out[4] + 1) = uVar7;
  *(uint *)((long)out[4] + 0xc) = uVar8;
  *(uint *)out[5] = uVar4;
  *(uint *)((long)out[5] + 4) = uVar6;
  *(uint *)(out[5] + 1) = uVar7;
  *(uint *)((long)out[5] + 0xc) = uVar8;
  *(uint *)out[6] = uVar4;
  *(uint *)((long)out[6] + 4) = uVar6;
  *(uint *)(out[6] + 1) = uVar7;
  *(uint *)((long)out[6] + 0xc) = uVar8;
  *(uint *)out[7] = uVar4;
  *(uint *)((long)out[7] + 4) = uVar6;
  *(uint *)(out[7] + 1) = uVar7;
  *(uint *)((long)out[7] + 0xc) = uVar8;
  *(uint *)out[8] = uVar4;
  *(uint *)((long)out[8] + 4) = uVar6;
  *(uint *)(out[8] + 1) = uVar7;
  *(uint *)((long)out[8] + 0xc) = uVar8;
  *(uint *)out[9] = uVar4;
  *(uint *)((long)out[9] + 4) = uVar6;
  *(uint *)(out[9] + 1) = uVar7;
  *(uint *)((long)out[9] + 0xc) = uVar8;
  *(uint *)out[10] = uVar4;
  *(uint *)((long)out[10] + 4) = uVar6;
  *(uint *)(out[10] + 1) = uVar7;
  *(uint *)((long)out[10] + 0xc) = uVar8;
  *(uint *)out[0xb] = uVar4;
  *(uint *)((long)out[0xb] + 4) = uVar6;
  *(uint *)(out[0xb] + 1) = uVar7;
  *(uint *)((long)out[0xb] + 0xc) = uVar8;
  *(uint *)out[0xc] = uVar4;
  *(uint *)((long)out[0xc] + 4) = uVar6;
  *(uint *)(out[0xc] + 1) = uVar7;
  *(uint *)((long)out[0xc] + 0xc) = uVar8;
  *(uint *)out[0xd] = uVar4;
  *(uint *)((long)out[0xd] + 4) = uVar6;
  *(uint *)(out[0xd] + 1) = uVar7;
  *(uint *)((long)out[0xd] + 0xc) = uVar8;
  *(uint *)out[0xe] = uVar4;
  *(uint *)((long)out[0xe] + 4) = uVar6;
  *(uint *)(out[0xe] + 1) = uVar7;
  *(uint *)((long)out[0xe] + 0xc) = uVar8;
  *(uint *)out[0xf] = uVar4;
  *(uint *)((long)out[0xf] + 4) = uVar6;
  *(uint *)(out[0xf] + 1) = uVar7;
  *(uint *)((long)out[0xf] + 0xc) = uVar8;
  *(uint *)out[0x10] = uVar4;
  *(uint *)((long)out[0x10] + 4) = uVar6;
  *(uint *)(out[0x10] + 1) = uVar7;
  *(uint *)((long)out[0x10] + 0xc) = uVar8;
  *(uint *)out[0x11] = uVar4;
  *(uint *)((long)out[0x11] + 4) = uVar6;
  *(uint *)(out[0x11] + 1) = uVar7;
  *(uint *)((long)out[0x11] + 0xc) = uVar8;
  *(uint *)out[0x12] = uVar4;
  *(uint *)((long)out[0x12] + 4) = uVar6;
  *(uint *)(out[0x12] + 1) = uVar7;
  *(uint *)((long)out[0x12] + 0xc) = uVar8;
  *(uint *)out[0x13] = uVar4;
  *(uint *)((long)out[0x13] + 4) = uVar6;
  *(uint *)(out[0x13] + 1) = uVar7;
  *(uint *)((long)out[0x13] + 0xc) = uVar8;
  *(uint *)out[0x14] = uVar4;
  *(uint *)((long)out[0x14] + 4) = uVar6;
  *(uint *)(out[0x14] + 1) = uVar7;
  *(uint *)((long)out[0x14] + 0xc) = uVar8;
  *(uint *)out[0x15] = uVar4;
  *(uint *)((long)out[0x15] + 4) = uVar6;
  *(uint *)(out[0x15] + 1) = uVar7;
  *(uint *)((long)out[0x15] + 0xc) = uVar8;
  *(uint *)out[0x16] = uVar4;
  *(uint *)((long)out[0x16] + 4) = uVar6;
  *(uint *)(out[0x16] + 1) = uVar7;
  *(uint *)((long)out[0x16] + 0xc) = uVar8;
  *(uint *)out[0x17] = uVar4;
  *(uint *)((long)out[0x17] + 4) = uVar6;
  *(uint *)(out[0x17] + 1) = uVar7;
  *(uint *)((long)out[0x17] + 0xc) = uVar8;
  *(uint *)out[0x18] = uVar4;
  *(uint *)((long)out[0x18] + 4) = uVar6;
  *(uint *)(out[0x18] + 1) = uVar7;
  *(uint *)((long)out[0x18] + 0xc) = uVar8;
  *(uint *)out[0x19] = uVar4;
  *(uint *)((long)out[0x19] + 4) = uVar6;
  *(uint *)(out[0x19] + 1) = uVar7;
  *(uint *)((long)out[0x19] + 0xc) = uVar8;
  *(uint *)out[0x1a] = uVar4;
  *(uint *)((long)out[0x1a] + 4) = uVar6;
  *(uint *)(out[0x1a] + 1) = uVar7;
  *(uint *)((long)out[0x1a] + 0xc) = uVar8;
  *(uint *)out[0x1b] = uVar4;
  *(uint *)((long)out[0x1b] + 4) = uVar6;
  *(uint *)(out[0x1b] + 1) = uVar7;
  *(uint *)((long)out[0x1b] + 0xc) = uVar8;
  *(uint *)out[0x1c] = uVar4;
  *(uint *)((long)out[0x1c] + 4) = uVar6;
  *(uint *)(out[0x1c] + 1) = uVar7;
  *(uint *)((long)out[0x1c] + 0xc) = uVar8;
  *(uint *)out[0x1d] = uVar4;
  *(uint *)((long)out[0x1d] + 4) = uVar6;
  *(uint *)(out[0x1d] + 1) = uVar7;
  *(uint *)((long)out[0x1d] + 0xc) = uVar8;
  *(uint *)out[0x1e] = uVar4;
  *(uint *)((long)out[0x1e] + 4) = uVar6;
  *(uint *)(out[0x1e] + 1) = uVar7;
  *(uint *)((long)out[0x1e] + 0xc) = uVar8;
  *(uint *)out[0x1f] = uVar4;
  *(uint *)((long)out[0x1f] + 4) = uVar6;
  *(uint *)(out[0x1f] + 1) = uVar7;
  *(uint *)((long)out[0x1f] + 0xc) = uVar8;
  return;
}

Assistant:

static void idct32x32_low1_sse4_1(__m128i *in, __m128i *out, int bit,
                                  int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rounding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i bf1;

  // stage 0
  // stage 1
  bf1 = in[0];

  // stage 2
  // stage 3
  // stage 4
  // stage 5
  bf1 = half_btf_0_sse4_1(&cospi32, &bf1, &rounding, bit);

  // stage 6
  // stage 7
  // stage 8
  // stage 9
  if (do_cols) {
    bf1 = _mm_max_epi32(bf1, clamp_lo);
    bf1 = _mm_min_epi32(bf1, clamp_hi);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    clamp_lo = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    clamp_hi = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);
    if (out_shift != 0) {
      __m128i offset = _mm_set1_epi32((1 << out_shift) >> 1);
      bf1 = _mm_add_epi32(bf1, offset);
      bf1 = _mm_sra_epi32(bf1, _mm_cvtsi32_si128(out_shift));
    }
  }

  bf1 = _mm_max_epi32(bf1, clamp_lo);
  bf1 = _mm_min_epi32(bf1, clamp_hi);
  out[0] = bf1;
  out[1] = bf1;
  out[2] = bf1;
  out[3] = bf1;
  out[4] = bf1;
  out[5] = bf1;
  out[6] = bf1;
  out[7] = bf1;
  out[8] = bf1;
  out[9] = bf1;
  out[10] = bf1;
  out[11] = bf1;
  out[12] = bf1;
  out[13] = bf1;
  out[14] = bf1;
  out[15] = bf1;
  out[16] = bf1;
  out[17] = bf1;
  out[18] = bf1;
  out[19] = bf1;
  out[20] = bf1;
  out[21] = bf1;
  out[22] = bf1;
  out[23] = bf1;
  out[24] = bf1;
  out[25] = bf1;
  out[26] = bf1;
  out[27] = bf1;
  out[28] = bf1;
  out[29] = bf1;
  out[30] = bf1;
  out[31] = bf1;
}